

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preview.c
# Opt level: O2

exr_result_t exr_attr_preview_init(exr_context_t ctxt,exr_attr_preview_t *p,uint32_t w,uint32_t h)

{
  exr_result_t eVar1;
  uint8_t *puVar2;
  ulong uVar3;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    uVar3 = (ulong)h * (ulong)w * 4;
    if (uVar3 >> 0x1f != 0) {
      eVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,"Invalid very large size for preview image (%u x %u - %lu bytes)",w,
                         h,uVar3);
      return eVar1;
    }
    if (p == (exr_attr_preview_t *)0x0) {
      eVar1 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid reference to preview object to initialize")
      ;
      return eVar1;
    }
    p->rgba = (uint8_t *)0x0;
    p->width = 0;
    p->height = 0;
    p->alloc_size = 0;
    eVar1 = 0;
    if (uVar3 != 0) {
      puVar2 = (uint8_t *)(**(code **)(ctxt + 0x58))(uVar3);
      p->rgba = puVar2;
      if (puVar2 == (uint8_t *)0x0) {
        eVar1 = (**(code **)(ctxt + 0x38))(ctxt,1);
        return eVar1;
      }
      p->alloc_size = uVar3;
      p->width = w;
      p->height = h;
    }
  }
  return eVar1;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER
/**************************************/

exr_result_t
exr_attr_preview_init (
    exr_context_t ctxt, exr_attr_preview_t* p, uint32_t w, uint32_t h)
{
    exr_attr_preview_t nil   = {0};
    uint64_t           bytes = (uint64_t) w * (uint64_t) h * (uint64_t) 4;

    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (bytes > (size_t) INT32_MAX)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid very large size for preview image (%u x %u - %" PRIu64
            " bytes)",
            w,
            h,
            (uint64_t) bytes);

    if (!p)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to preview object to initialize");

    *p = nil;
    if (bytes > 0)
    {
        p->rgba = (uint8_t*) pctxt->alloc_fn (bytes);
        if (p->rgba == NULL)
            return pctxt->standard_error (pctxt, EXR_ERR_OUT_OF_MEMORY);
        p->alloc_size = bytes;
        p->width      = w;
        p->height     = h;
    }
    return EXR_ERR_SUCCESS;
}